

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcreat.c
# Opt level: O1

MATRIX mat_fill(MATRIX A,int type)

{
  int iVar1;
  uint uVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  
  if (((uint)type < 2) && (iVar1 = *(int *)(A + -1), 0 < (long)iVar1)) {
    uVar2 = *(uint *)((long)A + -4);
    uVar4 = 0;
    do {
      if (0 < (int)uVar2) {
        pdVar3 = A[uVar4];
        uVar5 = 0;
        do {
          uVar6 = 0x3ff00000;
          if (uVar4 != uVar5) {
            uVar6 = 0;
          }
          if (type != 1) {
            uVar6 = 0;
          }
          pdVar3[uVar5] = (double)((ulong)uVar6 << 0x20);
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (long)iVar1);
  }
  return A;
}

Assistant:

MATRIX mat_fill( MATRIX A, int type )
{
	int	i, j;

	switch (type)
		{
		case UNDEFINED:
			break;
		case ZERO_MATRIX:
		case UNIT_MATRIX:
			for (i=0; i<MatRow(A); i++)
			for (j=0; j<MatCol(A); j++)
				{
				if (type == UNIT_MATRIX)
					{
					if (i==j)
						{
						A[i][j] = 1.0;
						continue;
						}
					}
				A[i][j] = 0.0;
				}
			break;
		}
	return (A);
}